

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resize.h
# Opt level: O0

_Bool av1_has_optimized_scaler(int src_width,int src_height,int dst_width,int dst_height)

{
  bool bVar1;
  bool local_14;
  _Bool local_13;
  _Bool has_optimized_scaler;
  int dst_height_local;
  int dst_width_local;
  int src_height_local;
  int src_width_local;
  
  bVar1 = false;
  if ((((src_width <= dst_width * 4) && (bVar1 = false, src_height <= dst_height * 4)) &&
      (bVar1 = false, dst_width <= src_width * 0x10)) &&
     (((bVar1 = false, dst_height <= src_height * 0x10 &&
       (bVar1 = false, (dst_width << 4) % src_width == 0)) &&
      ((bVar1 = false, (src_width << 4) % dst_width == 0 &&
       (bVar1 = false, (dst_height << 4) % src_height == 0)))))) {
    bVar1 = (src_height << 4) % dst_height == 0;
  }
  local_13 = true;
  if (!bVar1) {
    local_14 = dst_width << 2 == src_width * 3 && dst_height << 2 == src_height * 3;
    local_13 = local_14;
  }
  return local_13;
}

Assistant:

static inline bool av1_has_optimized_scaler(const int src_width,
                                            const int src_height,
                                            const int dst_width,
                                            const int dst_height) {
  bool has_optimized_scaler =
      (dst_width * 4 >= src_width && dst_height * 4 >= src_height) &&
      (dst_width <= src_width * 16 && dst_height <= src_height * 16) &&
      (16 * dst_width % src_width == 0) && (16 * src_width % dst_width == 0) &&
      (16 * dst_height % src_height == 0) &&
      (16 * src_height % dst_height == 0);
#if HAVE_SSSE3 || HAVE_NEON
  has_optimized_scaler =
      has_optimized_scaler ||
      (4 * dst_width == 3 * src_width && 4 * dst_height == 3 * src_height);
#endif
  return has_optimized_scaler;
}